

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
* __thiscall
TextBuffer::Layer::primitive_chunks
          (vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
           *__return_storage_ptr__,Layer *this)

{
  bool bVar1;
  int local_64;
  char16_t *local_60;
  pair<const_char16_t_*,_unsigned_int> local_58;
  anon_class_8_1_6971b95b local_48;
  Point local_3c;
  Point local_24;
  undefined1 local_19;
  Layer *local_18;
  Layer *this_local;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Layer *)__return_storage_ptr__;
  std::
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__);
  Point::Point(&local_24);
  local_3c = Point::max();
  local_48.result = __return_storage_ptr__;
  for_each_chunk_in_range<TextBuffer::Layer::primitive_chunks()::_lambda(TextSlice)_1_>
            (this,local_24,local_3c,&local_48,false);
  bVar1 = std::
          vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
          ::empty(__return_storage_ptr__);
  if (bVar1) {
    local_60 = L"";
    local_64 = 0;
    std::pair<const_char16_t_*,_unsigned_int>::pair<int,_true>(&local_58,&local_60,&local_64);
    std::
    vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
    ::push_back(__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<const char16_t *, uint32_t>> primitive_chunks() {
    vector<pair<const char16_t *, uint32_t>> result;
    for_each_chunk_in_range(Point(), Point::max(), [&result](TextSlice slice) {
      result.push_back({slice.data(), slice.size()});
      return false;
    });
    if (result.empty()) result.push_back({u"", 0});
    return result;

  }